

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
qpdf::Stream::replaceStreamData
          (Stream *this,shared_ptr<Buffer> *data,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  Members *decode_parms_00;
  QPDFObjectHandle *filter_00;
  element_type *this_00;
  size_t length;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_40;
  Members *local_30;
  Members *s;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  shared_ptr<Buffer> *data_local;
  Stream *this_local;
  
  s = (Members *)decode_parms;
  decode_parms_local = filter;
  filter_local = (QPDFObjectHandle *)data;
  data_local = (shared_ptr<Buffer> *)this;
  local_30 = stream(this);
  std::shared_ptr<Buffer>::operator=(&local_30->stream_data,data);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr(&local_40,(nullptr_t)0x0);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
            (&local_30->stream_provider,&local_40);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_40);
  filter_00 = decode_parms_local;
  decode_parms_00 = s;
  this_00 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)data
                      );
  length = Buffer::getSize(this_00);
  replaceFilterData(this,filter_00,(QPDFObjectHandle *)decode_parms_00,length);
  return;
}

Assistant:

void
Stream::replaceStreamData(
    std::shared_ptr<Buffer> data,
    QPDFObjectHandle const& filter,
    QPDFObjectHandle const& decode_parms)
{
    auto s = stream();
    s->stream_data = data;
    s->stream_provider = nullptr;
    replaceFilterData(filter, decode_parms, data->getSize());
}